

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_tracing_libapi.cpp
# Opt level: O0

ze_result_t zelTracerSetPrologues(zel_tracer_handle_t hTracer,zel_core_callbacks_t *pCoreCbs)

{
  zel_pfnTracerSetPrologues_t pfnSetPrologues;
  zel_core_callbacks_t *pCoreCbs_local;
  zel_tracer_handle_t hTracer_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    if (*(code **)(ze_lib::context + 0x38) == (code *)0x0) {
      hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    else {
      hTracer_local._4_4_ = (**(code **)(ze_lib::context + 0x38))(hTracer,pCoreCbs);
    }
  }
  else {
    hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hTracer_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zelTracerSetPrologues(
    zel_tracer_handle_t hTracer,                ///< [in] handle of the tracer
    zel_core_callbacks_t* pCoreCbs              ///< [in] pointer to table of 'core' callback function pointers
    )
{
    if(ze_lib::destruction)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    auto pfnSetPrologues = ze_lib::context->zelTracingDdiTable.Tracer.pfnSetPrologues;
    if( nullptr == pfnSetPrologues )
        return ZE_RESULT_ERROR_UNINITIALIZED;

    return pfnSetPrologues( hTracer, pCoreCbs );
}